

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O0

bool GMESong::Read(SoundStream *stream,void *buff,int len,void *userdata)

{
  int iVar1;
  gme_err_t pcVar2;
  int in_stack_ffffffffffffffbc;
  GMESong *song;
  gme_err_t err;
  void *userdata_local;
  int len_local;
  void *buff_local;
  SoundStream *stream_local;
  
  FCriticalSection::Enter((FCriticalSection *)((long)userdata + 0x18));
  iVar1 = gme_track_ended((Music_Emu *)0x412609);
  if (iVar1 != 0) {
    if (((ulong)(((Music_Emu *)userdata)->super_Gme_File).type_ & 0x100000000) == 0) {
      memset(buff,0,(long)len);
      FCriticalSection::Leave
                ((FCriticalSection *)&(((Music_Emu *)userdata)->super_Gme_File).warning_);
      return false;
    }
    StartTrack((GMESong *)userdata,
               *(int *)((long)&(((Music_Emu *)userdata)->super_Gme_File).playlist.entries.begin_ + 4
                       ),false);
  }
  pcVar2 = gme_play((Music_Emu *)userdata,in_stack_ffffffffffffffbc,(short *)0x412666);
  FCriticalSection::Leave((FCriticalSection *)&(((Music_Emu *)userdata)->super_Gme_File).warning_);
  return pcVar2 == (gme_err_t)0x0;
}

Assistant:

bool GMESong::Read(SoundStream *stream, void *buff, int len, void *userdata)
{
	gme_err_t err;
	GMESong *song = (GMESong *)userdata;

	song->CritSec.Enter();
	if (gme_track_ended(song->Emu))
	{
		if (song->m_Looping)
		{
			song->StartTrack(song->CurrTrack, false);
		}
		else
		{
			memset(buff, 0, len);
			song->CritSec.Leave();
			return false;
		}
	}
	err = gme_play(song->Emu, len >> 1, (short *)buff);
	song->CritSec.Leave();
	return (err == NULL);
}